

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian16Fallback
          (CodedInputStream *this,uint16_t *value)

{
  bool bVar1;
  uint16_t *buffer;
  uint8_t bytes [2];
  uint16_t local_12;
  
  buffer = (uint16_t *)this->buffer_;
  if (*(int *)&this->buffer_end_ - (int)buffer < 2) {
    buffer = &local_12;
    bVar1 = ReadRaw(this,buffer,2);
    if (!bVar1) {
      return false;
    }
  }
  else {
    this->buffer_ = (uint8_t *)(buffer + 1);
  }
  *value = *buffer;
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian16Fallback(uint16_t* value) {
  constexpr size_t kSize = sizeof(*value);
  uint8_t bytes[kSize];

  const uint8_t* ptr;
  if (BufferSize() >= static_cast<int64_t>(kSize)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(kSize);
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, kSize)) return false;
    ptr = bytes;
  }
  ReadLittleEndian16FromArray(ptr, value);
  return true;
}